

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

ostream * google::operator<<(ostream *os,Counter_t *param_2)

{
  long lVar1;
  LogMessageFatal local_70;
  
  lVar1 = __dynamic_cast(os,&std::ostream::typeinfo,&LogMessage::LogStream::typeinfo,0);
  if ((lVar1 != 0) && (lVar1 == *(long *)(lVar1 + 0x50))) {
    std::ostream::_M_insert<long>((long)os);
    return os;
  }
  LogMessageFatal::LogMessageFatal
            (&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
             ,0x7b0);
  std::__ostream_insert<char,std::char_traits<char>>
            (&((local_70.super_LogMessage.data_)->stream_).super_ostream,
             "Check failed: log && log == log->self() ",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            (&((local_70.super_LogMessage.data_)->stream_).super_ostream,
             "You must not use COUNTER with non-glog ostream",0x2e);
  LogMessageFatal::~LogMessageFatal(&local_70);
}

Assistant:

ostream& operator<<(ostream& os, const Counter_t&) {
#ifdef DISABLE_RTTI
  LogMessage::LogStream* log = static_cast<LogMessage::LogStream*>(&os);
#else
  auto* log = dynamic_cast<LogMessage::LogStream*>(&os);
#endif
  CHECK(log && log == log->self())
      << "You must not use COUNTER with non-glog ostream";
  os << log->ctr();
  return os;
}